

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TscClock.cpp
# Opt level: O0

int main(void)

{
  ulong uVar1;
  undefined8 uVar2;
  byte bVar3;
  cx_string<2UL> cVar4;
  _Ios_Openmode _Var5;
  undefined4 extraout_var;
  EventSource *eventSource;
  ClockSync *pCVar6;
  Session *pSVar7;
  bool bVar8;
  uint64_t _binlog_sid_v;
  SessionWriter writer;
  ClockSync tscSync;
  ClockSync systemClockSync;
  unsigned_long_long tscValue;
  Session session;
  ofstream logfile;
  memory_order __b;
  memory_order __b_1;
  undefined7 in_stack_fffffffffffffa78;
  undefined1 in_stack_fffffffffffffa7f;
  EventSource *in_stack_fffffffffffffa80;
  atomic<unsigned_long> *in_stack_fffffffffffffa88;
  undefined4 in_stack_fffffffffffffa90;
  int in_stack_fffffffffffffa94;
  ClockSync *in_stack_fffffffffffffa98;
  Session *in_stack_fffffffffffffaa0;
  Session *in_stack_fffffffffffffaf0;
  string *psVar9;
  string *in_stack_fffffffffffffb10;
  atomic<unsigned_long> *paVar10;
  undefined4 in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb1c;
  undefined4 in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb2c;
  SessionWriter *in_stack_fffffffffffffb30;
  allocator<char> local_4a1 [10];
  cx_string<2UL> local_497;
  allocator local_494;
  allocator local_493;
  allocator local_492;
  allocator local_491 [17];
  string local_480 [32];
  string local_460 [24];
  basic_ofstream<char,_std::char_traits<char>_> *in_stack_fffffffffffffbb8;
  Session *in_stack_fffffffffffffbc0;
  string local_418 [32];
  undefined1 local_3f8 [72];
  SessionWriter local_3b0;
  ulong local_380;
  uint64_t local_378;
  atomic<binlog::Severity> local_370;
  bool bStack_36e;
  undefined5 uStack_36d;
  undefined1 local_368 [64];
  undefined1 local_328 [40];
  ulong local_300;
  long local_240 [64];
  uint local_3c;
  ClockSync *local_38;
  memory_order local_30;
  int local_2c;
  atomic<unsigned_long> *local_28;
  ClockSync *local_20;
  memory_order local_18;
  int local_14;
  ClockSync *local_10;
  atomic<unsigned_long> *local_8;
  
  local_3c = 0;
  _Var5 = std::operator|(_S_out,_S_bin);
  std::ofstream::ofstream(local_240,"tscclock.blog",_Var5);
  binlog::Session::Session(in_stack_fffffffffffffaf0);
  uVar1 = rdtsc();
  local_300 = CONCAT44(extraout_var,(int)uVar1) | uVar1 & 0xffffffff00000000;
  binlog::systemClockSync();
  local_380 = local_300;
  local_378 = tscFrequency();
  local_370._M_i = local_368._56_2_;
  bStack_36e = (bool)local_368[0x3a];
  uStack_36d = local_368._59_5_;
  local_368._0_4_ = local_328._0_4_;
  std::__cxx11::string::string((string *)(local_368 + 8),(string *)(local_328 + 8));
  binlog::Session::setClockSync(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
  psVar9 = (string *)(local_3f8 + 0x28);
  std::__cxx11::string::string(psVar9);
  binlog::SessionWriter::SessionWriter
            (in_stack_fffffffffffffb30,
             (Session *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),(size_t)psVar9
             ,CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
             in_stack_fffffffffffffb10);
  std::__cxx11::string::~string((string *)(local_3f8 + 0x28));
  local_28 = &main::_binlog_sid;
  local_2c = 0;
  paVar10 = &main::_binlog_sid;
  local_30 = std::operator&(memory_order_relaxed,__memory_order_mask);
  if (local_2c - 1U < 2) {
    local_38 = (ClockSync *)(paVar10->super___atomic_base<unsigned_long>)._M_i;
  }
  else if (local_2c == 5) {
    local_38 = (ClockSync *)(paVar10->super___atomic_base<unsigned_long>)._M_i;
  }
  else {
    local_38 = (ClockSync *)(paVar10->super___atomic_base<unsigned_long>)._M_i;
  }
  local_3f8._32_8_ = local_38;
  pCVar6 = local_38;
  if (local_38 == (ClockSync *)0x0) {
    binlog::SessionWriter::session(&local_3b0);
    local_491[1] = (allocator)0x0;
    local_491[2] = (allocator)0x0;
    local_491[3] = (allocator)0x0;
    local_491[4] = (allocator)0x0;
    local_491[5] = (allocator)0x0;
    local_491[6] = (allocator)0x0;
    local_491[7] = (allocator)0x0;
    local_491[8] = (allocator)0x0;
    local_491[9] = (allocator)0x80;
    local_491[10] = (allocator)0x0;
    psVar9 = local_480;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(psVar9,"main",local_491);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_460,"main",&local_492);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffbc0,
               "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/example/TscClock.cpp"
               ,&local_493);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_418,"a={}, b={}",&local_494);
    pSVar7 = (Session *)local_3f8;
    local_4a1[5] = (allocator<char>)0x7b;
    local_4a1[6] = (allocator<char>)0x0;
    local_4a1[7] = (allocator<char>)0x0;
    local_4a1[8] = (allocator<char>)0x0;
    local_4a1[1] = (allocator<char>)0xc8;
    local_4a1[2] = (allocator<char>)0x1;
    local_4a1[3] = (allocator<char>)0x0;
    local_4a1[4] = (allocator<char>)0x0;
    cVar4 = binlog::detail::concatenated_tags<char_const(&)[11],int,int>
                      ((char (*) [11])in_stack_fffffffffffffa88,(int *)in_stack_fffffffffffffa80,
                       (int *)CONCAT17(in_stack_fffffffffffffa7f,in_stack_fffffffffffffa78));
    local_497._data._0_2_ = cVar4._data._0_2_;
    local_497._data[2] = cVar4._data[2];
    eventSource = (EventSource *)mserialize::cx_string<2UL>::data(&local_497);
    in_stack_fffffffffffffaa0 = (Session *)local_4a1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)pSVar7,(char *)eventSource,(allocator *)in_stack_fffffffffffffaa0);
    in_stack_fffffffffffffa98 = (ClockSync *)binlog::Session::addEventSource(pSVar7,eventSource);
    local_3f8._32_8_ = in_stack_fffffffffffffa98;
    binlog::EventSource::~EventSource(in_stack_fffffffffffffa80);
    std::allocator<char>::~allocator(local_4a1);
    std::allocator<char>::~allocator((allocator<char> *)&local_494);
    std::allocator<char>::~allocator((allocator<char> *)&local_493);
    std::allocator<char>::~allocator((allocator<char> *)&local_492);
    std::allocator<char>::~allocator((allocator<char> *)local_491);
    local_8 = &main::_binlog_sid;
    local_10 = (ClockSync *)local_3f8._32_8_;
    local_14 = 5;
    in_stack_fffffffffffffa88 = &main::_binlog_sid;
    local_18 = std::operator&(memory_order_seq_cst,__memory_order_mask);
    local_20 = local_10;
    pCVar6 = (ClockSync *)in_stack_fffffffffffffa88;
    in_stack_fffffffffffffa94 = local_14;
    if (local_14 == 3) {
      ((__atomic_base<unsigned_long> *)&((ClockSync *)in_stack_fffffffffffffa88)->clockValue)->_M_i
           = (__int_type)local_10;
    }
    else if (local_14 == 5) {
      LOCK();
      pCVar6 = (ClockSync *)
               ((__atomic_base<unsigned_long> *)
               &((ClockSync *)in_stack_fffffffffffffa88)->clockValue)->_M_i;
      ((__atomic_base<unsigned_long> *)&((ClockSync *)in_stack_fffffffffffffa88)->clockValue)->_M_i
           = (__int_type)local_10;
      UNLOCK();
    }
    else {
      ((__atomic_base<unsigned_long> *)&((ClockSync *)in_stack_fffffffffffffa88)->clockValue)->_M_i
           = (__int_type)local_10;
    }
  }
  uVar2 = rdtsc();
  pSVar7 = (Session *)CONCAT44((int)((ulong)pCVar6 >> 0x20),(int)uVar2);
  binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[11],int,int>
            ((SessionWriter *)in_stack_fffffffffffffaa0,(uint64_t)in_stack_fffffffffffffa98,
             CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
             (char (*) [11])in_stack_fffffffffffffa88,(int *)pSVar7,
             (int *)CONCAT17(in_stack_fffffffffffffa7f,in_stack_fffffffffffffa78));
  binlog::Session::consume<std::ofstream>(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  bVar3 = std::ios::operator!((ios *)((long)local_240 + *(long *)(local_240[0] + -0x18)));
  bVar8 = (bVar3 & 1) != 0;
  if (bVar8) {
    std::operator<<((ostream *)&std::cerr,"Failed to write tscclock.blog\n");
  }
  else {
    std::operator<<((ostream *)&std::cout,"Binary log written to tscclock.blog\n");
  }
  local_3c = (uint)bVar8;
  binlog::SessionWriter::~SessionWriter((SessionWriter *)0x102c59);
  binlog::ClockSync::~ClockSync((ClockSync *)0x102c66);
  binlog::ClockSync::~ClockSync((ClockSync *)0x102c73);
  binlog::Session::~Session(pSVar7);
  std::ofstream::~ofstream(local_240);
  return local_3c;
}

Assistant:

int main()
{
  std::ofstream logfile("tscclock.blog", std::ofstream::out|std::ofstream::binary);

  binlog::Session session;

  // Create a ClockSync, that connects the TSC value to the wall clock time.
  const auto tscValue = __rdtsc();
  const binlog::ClockSync systemClockSync = binlog::systemClockSync();
  const binlog::ClockSync tscSync{
    tscValue,
    tscFrequency(),
    systemClockSync.nsSinceEpoch,
    systemClockSync.tzOffset,
    systemClockSync.tzName
  };

  // Add the created ClockSync to the metadata of the session.
  // Events consumed after this are assumed to be timestamped
  // with the clock defined by the ClockSync (this case, TSC)
  session.setClockSync(tscSync);

  // Add one event, consume the writer queue...

  binlog::SessionWriter writer(session);
  TSC_INFO_W(writer, "a={}, b={}", 123, 456);

  session.consume(logfile);

  if (! logfile)
  {
    std::cerr << "Failed to write tscclock.blog\n";
    return 1;
  }

  std::cout << "Binary log written to tscclock.blog\n";
  return 0;
}